

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-context.cpp
# Opt level: O1

void __thiscall
llm_graph_input_k_shift::set_input(llm_graph_input_k_shift *this,llama_ubatch *ubatch)

{
  llama_kv_cache_unified *plVar1;
  void *pvVar2;
  llama_pos *plVar3;
  ulong uVar4;
  
  if ((this->k_shift != (ggml_tensor *)0x0) && (plVar1 = this->kv_self, plVar1->size != 0)) {
    pvVar2 = this->k_shift->data;
    plVar3 = &((plVar1->cells).super__Vector_base<llama_kv_cell,_std::allocator<llama_kv_cell>_>.
               _M_impl.super__Vector_impl_data._M_start)->delta;
    uVar4 = 0;
    do {
      *(llama_pos *)((long)pvVar2 + uVar4 * 4) = *plVar3;
      uVar4 = uVar4 + 1;
      plVar3 = plVar3 + 0x10;
    } while (uVar4 < plVar1->size);
  }
  return;
}

Assistant:

void llm_graph_input_k_shift::set_input(const llama_ubatch * ubatch) {
    GGML_UNUSED(ubatch);

    if (k_shift) {
        assert(ggml_backend_buffer_is_host(k_shift->buffer));

        int32_t * data = (int32_t *) k_shift->data;

        for (uint32_t i = 0; i < kv_self->size; ++i) {
            data[i] = kv_self->cells[i].delta;
        }
    }
}